

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<int(int&)>::callback<int(*)(int&)>
          (callback<int_(int_&)> *this,_func_int_int_ptr *func)

{
  callable<int_(int_&)> *p;
  callable_impl<int,_int_(*)(int_&)> *in_RDI;
  _func_int_int_ptr *in_stack_ffffffffffffffc8;
  intrusive_ptr<booster::callable<int_(int_&)>_> *in_stack_ffffffffffffffe0;
  
  p = (callable<int_(int_&)> *)operator_new(0x18);
  callback<int_(int_&)>::callable_impl<int,_int_(*)(int_&)>::callable_impl
            (in_RDI,in_stack_ffffffffffffffc8);
  intrusive_ptr<booster::callable<int_(int_&)>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}